

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlocksBuilder.h
# Opt level: O0

bool __thiscall
dg::BBlocksBuilder<dg::dda::RWBBlock>::enqueue(BBlocksBuilder<dg::dda::RWBBlock> *this,NodeT *n)

{
  IDType IVar1;
  long in_RSI;
  QueueFIFO<dg::dda::RWNode_*> *in_RDI;
  bool bVar2;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar3;
  RWNode **in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  undefined4 in_stack_ffffffffffffffd0;
  
  IVar1 = SubgraphNode<dg::dda::RWNode>::getID((SubgraphNode<dg::dda::RWNode> *)(in_RSI + 8));
  pVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     CONCAT44(IVar1,in_stack_ffffffffffffffd0),
                     (value_type_conflict *)
                     CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  bVar2 = ((pVar3.second ^ 0xffU) & 1) == 0;
  if (bVar2) {
    ADT::QueueFIFO<dg::dda::RWNode_*>::push(in_RDI,in_stack_ffffffffffffffa8);
  }
  return bVar2;
}

Assistant:

bool enqueue(NodeT *n) {
        // the id 0 is reserved for invalid nodes
        assert(n->getID() != 0 && "Queued invalid node");

        if (!static_cast<bool>(_processed.insert(n->getID()).second))
            return false; // we already queued this node

        _queue.push(n);
        assert(enqueue(n) == false);
        return true;
    }